

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,IConfigPtr *_fullConfig)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  shared_ptr<const_Catch::IConfig> *in_RSI;
  shared_ptr<const_Catch::IConfig> *in_RDI;
  
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x26d961);
  iVar1 = (*(peVar2->super_NonCopyable)._vptr_NonCopyable[3])();
  (in_RDI->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)CONCAT44(extraout_var,iVar1);
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr(in_RSI,in_RDI);
  return;
}

Assistant:

ReporterConfig::ReporterConfig( IConfigPtr const& _fullConfig )
    :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}